

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caches.cpp
# Opt level: O0

CacheSizes * node::CalculateCacheSizes(ArgsManager *args,size_t n_indexes)

{
  bool bVar1;
  int64_t iVar2;
  long *plVar3;
  ulong *puVar4;
  ulong in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  CacheSizes *in_RDI;
  long in_FS_OFFSET;
  int64_t max_cache;
  int64_t nTotalCache;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  ArgsManager *in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffed8;
  undefined1 fDefault;
  CacheSizes *__s;
  allocator<char> local_81;
  ulong local_80;
  long local_78;
  undefined8 local_70;
  long local_68;
  undefined8 local_60;
  allocator<char> local_51;
  long local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,(allocator<char> *)in_RDI);
  iVar2 = ArgsManager::GetIntArg
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffed8);
  fDefault = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  std::__cxx11::string::~string(in_stack_fffffffffffffec8);
  std::allocator<char>::~allocator(&local_51);
  local_60 = 0x400000;
  local_50 = iVar2 << 0x14;
  plVar3 = std::max<long>((long *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8);
  local_50 = *plVar3;
  local_68 = local_50;
  if (local_50 < 0) {
    local_68 = local_50 + 7;
  }
  local_68 = local_68 >> 3;
  local_70 = 0x200000;
  plVar3 = _GLOBAL__N_1::std::min<long>
                     ((long *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8);
  in_RDI->block_tree_db = *plVar3;
  local_50 = local_50 - in_RDI->block_tree_db;
  local_78 = local_50;
  if (local_50 < 0) {
    local_78 = local_50 + 7;
  }
  local_78 = local_78 >> 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,(allocator<char> *)in_RDI);
  bVar1 = ArgsManager::GetBoolArg
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(bool)fDefault);
  local_80 = (ulong)((uint)bVar1 << 0x1e);
  plVar3 = _GLOBAL__N_1::std::min<long>
                     ((long *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8);
  in_RDI->tx_index = *plVar3;
  std::__cxx11::string::~string(in_stack_fffffffffffffec8);
  std::allocator<char>::~allocator(&local_81);
  local_50 = local_50 - in_RDI->tx_index;
  in_RDI->filter_index = 0;
  if (in_RDX != 0) {
    puVar4 = (ulong *)_GLOBAL__N_1::std::min<long>
                                ((long *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8
                                );
    in_RDI->filter_index = *puVar4 / in_RDX;
    local_50 = local_50 - in_RDI->filter_index * in_RDX;
  }
  plVar3 = _GLOBAL__N_1::std::min<long>
                     ((long *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8);
  in_RDI->coins_db = *plVar3;
  plVar3 = _GLOBAL__N_1::std::min<long>
                     ((long *)in_stack_fffffffffffffed0,(long *)in_stack_fffffffffffffec8);
  in_RDI->coins_db = *plVar3;
  local_50 = local_50 - in_RDI->coins_db;
  in_RDI->coins = local_50;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return __s;
  }
  __stack_chk_fail();
}

Assistant:

CacheSizes CalculateCacheSizes(const ArgsManager& args, size_t n_indexes)
{
    int64_t nTotalCache = (args.GetIntArg("-dbcache", nDefaultDbCache) << 20);
    nTotalCache = std::max(nTotalCache, nMinDbCache << 20); // total cache cannot be less than nMinDbCache
    CacheSizes sizes;
    sizes.block_tree_db = std::min(nTotalCache / 8, nMaxBlockDBCache << 20);
    nTotalCache -= sizes.block_tree_db;
    sizes.tx_index = std::min(nTotalCache / 8, args.GetBoolArg("-txindex", DEFAULT_TXINDEX) ? nMaxTxIndexCache << 20 : 0);
    nTotalCache -= sizes.tx_index;
    sizes.filter_index = 0;
    if (n_indexes > 0) {
        int64_t max_cache = std::min(nTotalCache / 8, max_filter_index_cache << 20);
        sizes.filter_index = max_cache / n_indexes;
        nTotalCache -= sizes.filter_index * n_indexes;
    }
    sizes.coins_db = std::min(nTotalCache / 2, (nTotalCache / 4) + (1 << 23)); // use 25%-50% of the remainder for disk cache
    sizes.coins_db = std::min(sizes.coins_db, nMaxCoinsDBCache << 20); // cap total coins db cache
    nTotalCache -= sizes.coins_db;
    sizes.coins = nTotalCache; // the rest goes to in-memory cache
    return sizes;
}